

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O1

vector<hrgls::Message,_std::allocator<hrgls::Message>_> * __thiscall
hrgls::API::GetPendingLogMessages
          (vector<hrgls::Message,_std::allocator<hrgls::Message>_> *__return_storage_ptr__,API *this
          ,size_t maxNum)

{
  int iVar1;
  API_private *pAVar2;
  bool bVar3;
  mapped_type mVar4;
  pthread_t pVar5;
  mapped_type *pmVar6;
  hrgls_Message m;
  key_type local_40;
  key_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar2 = this->m_private;
  if (pAVar2 != (API_private *)0x0) {
    pVar5 = pthread_self();
    local_38._M_thread = pVar5;
    pmVar6 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar2->m_status,&local_38);
    *pmVar6 = 0;
    bVar3 = false;
    do {
      if (maxNum - 1 <
          (ulong)((long)(__return_storage_ptr__->
                        super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 3)) {
        return __return_storage_ptr__;
      }
      local_38._M_thread = 0;
      mVar4 = hrgls_APIGetNextLogMessage(this->m_private->m_api,&local_38);
      local_40._M_thread = pVar5;
      pmVar6 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_40);
      *pmVar6 = mVar4;
      local_40._M_thread = pVar5;
      pmVar6 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_40);
      iVar1 = *pmVar6;
      if (iVar1 == 0) {
        Message::Message((Message *)&local_40,(hrgls_Message)local_38._M_thread);
        std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::emplace_back<hrgls::Message>
                  (__return_storage_ptr__,(Message *)&local_40);
        Message::~Message((Message *)&local_40);
        hrgls_MessageDestroy(local_38._M_thread);
      }
      else {
        hrgls_MessageDestroy(local_38._M_thread);
        local_40._M_thread = pVar5;
        pmVar6 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,&local_40);
        if (*pmVar6 == 1) {
          bVar3 = true;
          if ((__return_storage_ptr__->
              super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (__return_storage_ptr__->
              super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            local_40._M_thread = pVar5;
            pmVar6 = std::
                     map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                     ::operator[](&this->m_private->m_status,&local_40);
            *pmVar6 = 0;
          }
        }
        else {
          bVar3 = true;
        }
      }
    } while (iVar1 == 0);
    if (!bVar3) {
      std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Message> API::GetPendingLogMessages(size_t maxNum)
  {
    std::vector<Message> ret;
    if (!m_private) {
      return ret;
    }

    // Keep getting messages until we either have enough or get a status other
    // than OKAY.  Push each onto the vector, then destroy it.
    m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
    while ((ret.size() < maxNum) || (maxNum == 0)) {
      hrgls_Message m = nullptr;
      m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetNextLogMessage(m_private->m_api, &m);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_MessageDestroy(m);
        if ((m_private->m_status[std::this_thread::get_id()] == hrgls_STATUS_TIMEOUT) &&
            (ret.size() > 0)) {
          // We got at least one message before timing out, so things are
          // okay.
          m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
        }
        return ret;
      }
      ret.push_back(m);
      hrgls_MessageDestroy(m);
    }

    return ret;
  }